

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix-test.cc
# Opt level: O2

void __thiscall
SuffixTest_VisitIntSuffixValues_Test::TestBody(SuffixTest_VisitIntSuffixValues_Test *this)

{
  MockSpec<void_(int,_int)> *pMVar1;
  StringRef name;
  MatcherBase<int> local_140;
  MatcherBase<int> local_128;
  MutIntSuffix s;
  MockValueVisitor v;
  
  v.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase =
       (_func_int **)
       &v.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.super_UntypedFunctionMockerBase
        .name_;
  v.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.super_UntypedFunctionMockerBase.
  mock_obj_ = (void *)0x0;
  v.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.super_UntypedFunctionMockerBase.name_
  ._0_1_ = 0;
  name.size_ = 4;
  name.data_ = "test";
  s.super_BasicSuffix<int>.super_SuffixBase.impl_ =
       (BasicSuffix<int>)
       mp::BasicSuffixSet<std::allocator<char>_>::Add<int>
                 (&(this->super_SuffixTest).suffixes_,name,0,3,(SuffixTable *)&v);
  std::__cxx11::string::~string((string *)&v);
  mp::BasicMutSuffix<int>::set_value(&s,0,0x2a);
  mp::BasicMutSuffix<int>::set_value(&s,1,0);
  mp::BasicMutSuffix<int>::set_value(&s,2,0xb);
  MockValueVisitor::MockValueVisitor(&v);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_128,0);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_140,0x2a);
  pMVar1 = MockValueVisitor::gmock_Visit(&v,(Matcher<int> *)&local_128,(Matcher<int> *)&local_140);
  testing::internal::MockSpec<void_(int,_int)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/suffix-test.cc",0x9c,
             "v","Visit(0, Matcher<int>(42))");
  testing::internal::MatcherBase<int>::~MatcherBase(&local_140);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_128);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_128,2);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_140,0xb);
  pMVar1 = MockValueVisitor::gmock_Visit(&v,(Matcher<int> *)&local_128,(Matcher<int> *)&local_140);
  testing::internal::MockSpec<void_(int,_int)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/suffix-test.cc",0x9d,
             "v","Visit(2, Matcher<int>(11))");
  testing::internal::MatcherBase<int>::~MatcherBase(&local_140);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_128);
  mp::BasicSuffix<int>::VisitValues<MockValueVisitor>(&s.super_BasicSuffix<int>,&v);
  MockValueVisitor::~MockValueVisitor(&v);
  return;
}

Assistant:

TEST_F(SuffixTest, VisitIntSuffixValues) {
  mp::MutIntSuffix s = suffixes_.Add<int>("test", 0, 3);
  s.set_value(0, 42);
  s.set_value(1, 0);
  s.set_value(2, 11);
  MockValueVisitor v;
  EXPECT_CALL(v, Visit(0, Matcher<int>(42)));
  EXPECT_CALL(v, Visit(2, Matcher<int>(11)));
  s.VisitValues(v);
}